

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

uint32_t __thiscall
CompressedArray::calculate_key_size(CompressedArray *this,Key key,Key prev_key,bool same_word)

{
  uint32_t uVar1;
  undefined3 in_register_00000009;
  uint32_t log_radix;
  CompressedArray *this_00;
  uint32_t uVar2;
  
  uVar2 = key.context_index;
  uVar1 = 0;
  this_00 = this;
  if (CONCAT31(in_register_00000009,same_word) == 0) {
    uVar1 = calculate_number_size
                      (this,key.word_index - prev_key.word_index,this->word_index_diff_log_radix);
  }
  if (key.word_index == prev_key.word_index) {
    uVar2 = uVar2 - prev_key.context_index;
    log_radix = this->context_index_diff_log_radix;
  }
  else {
    log_radix = this->context_index_log_radix;
  }
  uVar2 = calculate_number_size(this_00,uVar2,log_radix);
  return uVar2 + uVar1;
}

Assistant:

uint32_t CompressedArray::calculate_key_size(Key key, Key prev_key, bool same_word) const {
    uint32_t size = 0;
    if (!same_word)
        size += calculate_number_size(key.word_index - prev_key.word_index,
                                      word_index_diff_log_radix);
    if (key.word_index == prev_key.word_index)
        size += calculate_number_size(key.context_index - prev_key.context_index,
                                      context_index_diff_log_radix);
    else
        size += calculate_number_size(key.context_index, context_index_log_radix);
    return size;
}